

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManAreDepth(Gia_ManAre_t *p,int iState)

{
  int iVar1;
  undefined4 local_24;
  Gia_StaAre_t *pGStack_20;
  int Counter;
  Gia_StaAre_t *pSta;
  int iState_local;
  Gia_ManAre_t *p_local;
  
  local_24 = 0;
  pGStack_20 = Gia_ManAreStaInt(p,iState);
  while( true ) {
    iVar1 = Gia_StaIsGood(p,pGStack_20);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
    pGStack_20 = Gia_StaPrev(p,pGStack_20);
  }
  return local_24;
}

Assistant:

int Gia_ManAreDepth( Gia_ManAre_t * p, int iState )
{
    Gia_StaAre_t * pSta;
    int Counter = 0;
    for ( pSta = Gia_ManAreStaInt(p, iState); Gia_StaIsGood(p, pSta); pSta = Gia_StaPrev(p, pSta) )
        Counter++;
    return Counter;
}